

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

double __thiscall wdm::utils::pow(utils *this,double __x,double __y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_RDX;
  long *in_RSI;
  long lVar4;
  long lVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  allocator_type local_21;
  value_type_conflict local_20;
  
  local_20 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this,in_RSI[1] - *in_RSI >> 3,&local_20,
             &local_21);
  dVar6 = extraout_XMM0_Qa;
  if (in_RDX != 0) {
    lVar1 = *in_RSI;
    lVar2 = in_RSI[1];
    lVar3 = *(long *)this;
    for (lVar4 = 0; lVar5 = in_RDX, lVar4 != lVar2 - lVar1 >> 3; lVar4 = lVar4 + 1) {
      while (lVar5 != 0) {
        dVar6 = *(double *)(lVar1 + lVar4 * 8) * *(double *)(lVar3 + lVar4 * 8);
        *(double *)(lVar3 + lVar4 * 8) = dVar6;
        lVar5 = lVar5 + -1;
      }
    }
  }
  return dVar6;
}

Assistant:

inline std::vector<double> pow(const std::vector<double>& x, size_t n)
{
    std::vector<double> res(x.size(), 1.0);
    if (n > 0) {
        for (size_t i = 0; i < x.size(); i++) {
            for (size_t j = 0; j < n; j++) {
                res[i] *= x[i];
            }
        }
    }

    return res;
}